

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseServiceMethod
          (Parser *this,MethodDescriptorProto *method,LocationRecorder *method_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  string *psVar4;
  MethodOptions *mutable_options;
  undefined8 *puVar5;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  bVar2 = Consume(this,"rpc");
  if (bVar2) {
    LocationRecorder::LocationRecorder(&LStack_48,method_location,1);
    LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,NAME);
    *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 1;
    uVar1 = (method->super_Message).super_MessageLite._internal_metadata_.ptr_;
    puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      puVar5 = (undefined8 *)*puVar5;
    }
    psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&method->name_,puVar5);
    bVar2 = ConsumeIdentifier(this,psVar4,"Expected method name.");
    LocationRecorder::~LocationRecorder(&LStack_48);
    if ((bVar2) && (bVar2 = Consume(this,"("), bVar2)) {
      iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
      if (iVar3 == 0) {
        LocationRecorder::LocationRecorder(&LStack_48,method_location,5);
        LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OTHER);
        *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x10;
        method->client_streaming_ = true;
        bVar2 = Consume(this,"stream");
        LocationRecorder::~LocationRecorder(&LStack_48);
        if (!bVar2) {
          return false;
        }
      }
      LocationRecorder::LocationRecorder(&LStack_48,method_location,2);
      LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,INPUT_TYPE);
      *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 2;
      uVar1 = (method->super_Message).super_MessageLite._internal_metadata_.ptr_;
      puVar5 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      if ((uVar1 & 1) != 0) {
        puVar5 = (undefined8 *)*puVar5;
      }
      psVar4 = internal::ArenaStringPtr::Mutable_abi_cxx11_(&method->input_type_,puVar5);
      bVar2 = ParseUserDefinedType(this,psVar4);
      LocationRecorder::~LocationRecorder(&LStack_48);
      if ((((bVar2) && (bVar2 = Consume(this,")"), bVar2)) &&
          (bVar2 = Consume(this,"returns"), bVar2)) && (bVar2 = Consume(this,"("), bVar2)) {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 == 0) {
          LocationRecorder::LocationRecorder(&LStack_48,method_location,6);
          LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OTHER);
          bVar2 = Consume(this,"stream");
          if (!bVar2) {
            LocationRecorder::~LocationRecorder(&LStack_48);
            return false;
          }
          *(byte *)(method->_has_bits_).has_bits_ = (byte)(method->_has_bits_).has_bits_[0] | 0x20;
          method->server_streaming_ = true;
          LocationRecorder::~LocationRecorder(&LStack_48);
        }
        LocationRecorder::LocationRecorder(&LStack_48,method_location,3);
        LocationRecorder::RecordLegacyLocation(&LStack_48,&method->super_Message,OUTPUT_TYPE);
        psVar4 = MethodDescriptorProto::mutable_output_type_abi_cxx11_(method);
        bVar2 = ParseUserDefinedType(this,psVar4);
        LocationRecorder::~LocationRecorder(&LStack_48);
        if ((bVar2) && (bVar2 = Consume(this,")"), bVar2)) {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar3 == 0) {
            mutable_options = MethodDescriptorProto::mutable_options(method);
            bVar2 = ParseMethodOptions(this,method_location,containing_file,4,
                                       &mutable_options->super_Message);
          }
          else {
            bVar2 = ConsumeEndOfDeclaration(this,";",method_location);
          }
          if (bVar2 != false) {
            return true;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool Parser::ParseServiceMethod(MethodDescriptorProto* method,
                                const LocationRecorder& method_location,
                                const FileDescriptorProto* containing_file) {
  DO(Consume("rpc"));

  {
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kNameFieldNumber);
    location.RecordLegacyLocation(method, DescriptorPool::ErrorCollector::NAME);
    DO(ConsumeIdentifier(method->mutable_name(), "Expected method name."));
  }

  // Parse input type.
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kClientStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      method->set_client_streaming(true);
      DO(Consume("stream"));

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kInputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::INPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_input_type()));
  }
  DO(Consume(")"));

  // Parse output type.
  DO(Consume("returns"));
  DO(Consume("("));
  {
    if (LookingAt("stream")) {
      LocationRecorder location(
          method_location, MethodDescriptorProto::kServerStreamingFieldNumber);
      location.RecordLegacyLocation(method,
                                    DescriptorPool::ErrorCollector::OTHER);
      DO(Consume("stream"));
      method->set_server_streaming(true);

    }
    LocationRecorder location(method_location,
                              MethodDescriptorProto::kOutputTypeFieldNumber);
    location.RecordLegacyLocation(method,
                                  DescriptorPool::ErrorCollector::OUTPUT_TYPE);
    DO(ParseUserDefinedType(method->mutable_output_type()));
  }
  DO(Consume(")"));

  if (LookingAt("{")) {
    // Options!
    DO(ParseMethodOptions(method_location, containing_file,
                          MethodDescriptorProto::kOptionsFieldNumber,
                          method->mutable_options()));
  } else {
    DO(ConsumeEndOfDeclaration(";", &method_location));
  }

  return true;
}